

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

bool __thiscall
Typelib::ValueVisitor::TypeDispatch::integer_cast<signed_char,short,int,long>
          (TypeDispatch *this,uint8_t *value,Type *t)

{
  Type *type_;
  int iVar1;
  size_t sVar2;
  UnsupportedType *this_00;
  allocator local_49;
  string local_48 [32];
  Type *local_28;
  Type *t_local;
  uint8_t *value_local;
  TypeDispatch *this_local;
  
  local_28 = t;
  t_local = (Type *)value;
  value_local = (uint8_t *)this;
  sVar2 = Type::getSize(t);
  switch(sVar2) {
  case 1:
    iVar1 = (**this->m_visitor->_vptr_ValueVisitor)(this->m_visitor,t_local);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
    break;
  case 2:
    iVar1 = (*this->m_visitor->_vptr_ValueVisitor[2])(this->m_visitor,t_local);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
    break;
  default:
    this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    type_ = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"unsupported integer size",&local_49);
    UnsupportedType::UnsupportedType(this_00,type_,(string *)local_48);
    __cxa_throw(this_00,&UnsupportedType::typeinfo,UnsupportedType::~UnsupportedType);
  case 4:
    iVar1 = (*this->m_visitor->_vptr_ValueVisitor[4])(this->m_visitor,t_local);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
    break;
  case 8:
    iVar1 = (*this->m_visitor->_vptr_ValueVisitor[6])(this->m_visitor,t_local);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool integer_cast(uint8_t* value, Type const& t)
        {
            switch(t.getSize())
            {
                case 1: return m_visitor.visit_(*reinterpret_cast<T8*>(value));
                case 2: return m_visitor.visit_(*reinterpret_cast<T16*>(value));
                case 4: return m_visitor.visit_(*reinterpret_cast<T32*>(value));
                case 8: return m_visitor.visit_(*reinterpret_cast<T64*>(value));
                default:
                         throw UnsupportedType(t, "unsupported integer size");
            };
        }